

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O1

void __thiscall Nes_Triangle::clock_linear_counter(Nes_Triangle *this)

{
  uint uVar1;
  
  if ((this->super_Nes_Osc).reg_written[3] == true) {
    uVar1 = (this->super_Nes_Osc).regs[0] & 0x7f;
  }
  else {
    if (this->linear_counter == 0) goto LAB_006d52f0;
    uVar1 = this->linear_counter - 1;
  }
  this->linear_counter = uVar1;
LAB_006d52f0:
  if (-1 < (char)(this->super_Nes_Osc).regs[0]) {
    (this->super_Nes_Osc).reg_written[3] = false;
  }
  return;
}

Assistant:

void Nes_Triangle::clock_linear_counter()
{
	if ( reg_written [3] )
		linear_counter = regs [0] & 0x7F;
	else if ( linear_counter )
		linear_counter--;
	
	if ( !(regs [0] & 0x80) )
		reg_written [3] = false;
}